

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistoQueueFixPair(int bad_id,int good_id,HistogramPair *pair)

{
  int tmp;
  int iVar1;
  int iVar2;
  
  iVar1 = pair->idx1;
  if (pair->idx1 == bad_id) {
    pair->idx1 = good_id;
    iVar1 = good_id;
  }
  iVar2 = pair->idx2;
  if (pair->idx2 == bad_id) {
    pair->idx2 = good_id;
    iVar2 = good_id;
  }
  if (iVar2 < iVar1) {
    pair->idx1 = iVar2;
    pair->idx2 = iVar1;
  }
  return;
}

Assistant:

static void HistoQueueFixPair(int bad_id, int good_id,
                              HistogramPair* const pair) {
  if (pair->idx1 == bad_id) pair->idx1 = good_id;
  if (pair->idx2 == bad_id) pair->idx2 = good_id;
  if (pair->idx1 > pair->idx2) {
    const int tmp = pair->idx1;
    pair->idx1 = pair->idx2;
    pair->idx2 = tmp;
  }
}